

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

LispPTR COM_readpage(LispPTR *args)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  __off_t _Var4;
  ssize_t sVar5;
  uint uVar6;
  DLword *__buf;
  stat sbuf;
  stat local_c0;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    uVar6 = args[3];
    if ((uVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
    }
    Lisp_errno = (int *)(Lisp_world + uVar6);
    uVar6 = *args;
    if ((uVar6 & 0xfff0000) == 0xf0000) {
      uVar6 = uVar6 | 0xffff0000;
    }
    else if ((uVar6 & 0xfff0000) == 0xe0000) {
      uVar6 = uVar6 & 0xffff;
    }
    else {
      if ((uVar6 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
      }
      uVar6 = *(uint *)(Lisp_world + uVar6);
    }
    uVar2 = args[1];
    if ((uVar2 & 0xfff0000) == 0xf0000) {
      uVar2 = uVar2 | 0xffff0000;
    }
    else if ((uVar2 & 0xfff0000) == 0xe0000) {
      uVar2 = uVar2 & 0xffff;
    }
    else {
      if ((uVar2 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      }
      uVar2 = *(uint *)(Lisp_world + uVar2);
    }
    __buf = Lisp_world + args[2];
    alarm(TIMEOUT_TIME);
    piVar3 = __errno_location();
    do {
      *piVar3 = 0;
      iVar1 = fstat(uVar6,&local_c0);
      if (iVar1 != -1) break;
    } while (*piVar3 == 4);
    alarm(0);
    if (iVar1 != 0) {
      *Lisp_errno = *piVar3;
      return 0;
    }
    if ((local_c0.st_mode & 0xf000) == 0x8000) {
      do {
        alarm(TIMEOUT_TIME);
        do {
          *piVar3 = 0;
          _Var4 = lseek(uVar6,(long)(int)(uVar2 << 9),0);
          if (_Var4 != -1) {
            alarm(0);
            goto LAB_0011fbfa;
          }
        } while (*piVar3 == 4);
        alarm(0);
        iVar1 = *piVar3;
      } while (iVar1 == 4);
    }
    else {
LAB_0011fbfa:
      do {
        alarm(TIMEOUT_TIME);
        do {
          *piVar3 = 0;
          sVar5 = read(uVar6,__buf,0x200);
          if (sVar5 != -1) {
            alarm(0);
            memset((void *)((long)__buf + sVar5),0,0x200 - sVar5);
            word_swap_page(__buf,0x80);
            if (sVar5 < 0) {
              if (-0x10001 < sVar5) {
                return (uint)sVar5 & 0xffff | 0xf0000;
              }
            }
            else if (sVar5 < 0x10000) {
              return (uint)sVar5 | 0xe0000;
            }
            error("Not Smallp data");
            return 0xe0000;
          }
        } while (*piVar3 == 4);
        alarm(0);
        iVar1 = *piVar3;
      } while (iVar1 == 4);
    }
    *Lisp_errno = iVar1;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR COM_readpage(LispPTR *args)
{
  char *bufp;
  int fd, npage, rval;
  ssize_t count;
  off_t offval;
  struct stat sbuf;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  fd = LispNumToCInt(args[0]);
  npage = LispNumToCInt(args[1]);
  bufp = (char *)NativeAligned2FromLAddr(args[2]);

  TIMEOUT(rval = fstat(fd, &sbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }

  if (S_ISREG(sbuf.st_mode)) {
  /*
   * The request file is a regular file.  We have to make sure that
   * next byte read is at the beginning of the requested page of the
   * file.  If the request file is special file, lseek is not needed.
   */
  sklp:
    TIMEOUT(offval = lseek(fd, (npage * FDEV_PAGE_SIZE), SEEK_SET));
    if (offval == -1) {
      if (errno == EINTR) goto sklp; /* interrupted, retry */
      *Lisp_errno = errno;
      return (NIL);
    }
  }

rdlp:
  TIMEOUT(count = read(fd, bufp, FDEV_PAGE_SIZE));
  if (count == -1) {
    if (errno == EINTR) goto rdlp; /* interrupted; retry */
    *Lisp_errno = errno;
    return (NIL);
  }

  /* O out the remaining part of the buffer. */
  memset(&bufp[count], 0, FDEV_PAGE_SIZE - count);

#ifdef BYTESWAP
  word_swap_page((DLword *)bufp, FDEV_PAGE_SIZE / 4);
#endif /* BYTESWAP */

  return (GetSmallp(count));
}